

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall
spvtools::opt::Instruction::Instruction
          (Instruction *this,IRContext *c,spv_parsed_instruction_t *inst,
          vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *dbg_line)

{
  spv_parsed_operand_t *psVar1;
  pointer pIVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t i;
  ulong uVar5;
  long lVar6;
  uint32_t *local_40;
  uint32_t *local_38;
  
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = (Instruction *)0x0;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ = false;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_003adc30;
  this->context_ = c;
  this->opcode_ = (uint)inst->opcode;
  this->has_type_id_ = inst->type_id != 0;
  this->has_result_id_ = inst->result_id != 0;
  uVar4 = IRContext::TakeNextUniqueId(c);
  this->unique_id_ = uVar4;
  (this->operands_).
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->operands_).
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->operands_).
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar2 = (dbg_line->
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->dbg_line_insts_).
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (dbg_line->
       super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->dbg_line_insts_).
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_finish = pIVar2;
  (this->dbg_line_insts_).
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (dbg_line->
       super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (dbg_line->
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (dbg_line->
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (dbg_line->
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dbg_scope_).lexical_scope_ = 0;
  (this->dbg_scope_).inlined_at_ = 0;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::reserve
            (&this->operands_,(ulong)inst->num_operands);
  lVar6 = 4;
  for (uVar5 = 0; uVar5 < inst->num_operands; uVar5 = uVar5 + 1) {
    psVar1 = inst->operands;
    local_38 = inst->words + *(ushort *)((long)psVar1 + lVar6 + -4);
    local_40 = local_38 + *(ushort *)((long)psVar1 + lVar6 + -2);
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spv_operand_type_t_const&,unsigned_int_const*,unsigned_int_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
               &this->operands_,(spv_operand_type_t *)((long)&psVar1->offset + lVar6),&local_38,
               &local_40);
    lVar6 = lVar6 + 0x10;
  }
  bVar3 = IsLineInst(this);
  if ((bVar3) &&
     ((dbg_line->
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (dbg_line->
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>).
      _M_impl.super__Vector_impl_data._M_finish)) {
    __assert_fail("(!IsLineInst() || dbg_line.empty()) && \"Op(No)Line attaching to Op(No)Line found\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.cpp"
                  ,0x54,
                  "spvtools::opt::Instruction::Instruction(IRContext *, const spv_parsed_instruction_t &, std::vector<Instruction> &&)"
                 );
  }
  return;
}

Assistant:

Instruction::Instruction(IRContext* c, const spv_parsed_instruction_t& inst,
                         std::vector<Instruction>&& dbg_line)
    : utils::IntrusiveNodeBase<Instruction>(),
      context_(c),
      opcode_(static_cast<spv::Op>(inst.opcode)),
      has_type_id_(inst.type_id != 0),
      has_result_id_(inst.result_id != 0),
      unique_id_(c->TakeNextUniqueId()),
      dbg_line_insts_(std::move(dbg_line)),
      dbg_scope_(kNoDebugScope, kNoInlinedAt) {
  operands_.reserve(inst.num_operands);
  for (uint32_t i = 0; i < inst.num_operands; ++i) {
    const auto& current_payload = inst.operands[i];
    operands_.emplace_back(
        current_payload.type, inst.words + current_payload.offset,
        inst.words + current_payload.offset + current_payload.num_words);
  }
  assert((!IsLineInst() || dbg_line.empty()) &&
         "Op(No)Line attaching to Op(No)Line found");
}